

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

int adt_str_lt_ascii(adt_str_t *self,adt_str_t *other)

{
  int local_38;
  uint8_t rightChr;
  int32_t iStack_34;
  uint8_t leftChr;
  int32_t remainRight;
  int32_t remainLeft;
  uint8_t *strRight;
  uint8_t *strLeft;
  adt_str_t *other_local;
  adt_str_t *self_local;
  
  strRight = self->pAlloc;
  _remainRight = other->pAlloc;
  iStack_34 = self->s32Cur;
  local_38 = other->s32Cur;
  while( true ) {
    if (iStack_34 < 1) {
      return 0;
    }
    if (local_38 == 0) {
      return 1;
    }
    if (*strRight < *_remainRight) {
      return 1;
    }
    if (*_remainRight < *strRight) break;
    strRight = strRight + 1;
    _remainRight = _remainRight + 1;
    iStack_34 = iStack_34 + -1;
    local_38 = local_38 + -1;
  }
  return 0;
}

Assistant:

static int adt_str_lt_ascii(const adt_str_t *self, const adt_str_t *other)
{
   const uint8_t *strLeft = self->pAlloc;
   const uint8_t *strRight = other->pAlloc;
   int32_t remainLeft = self->s32Cur;
   int32_t remainRight = other->s32Cur;

   while( remainLeft > 0 )
   {
      if ( remainRight == 0 )
      {
         return 1;
      }
      else
      {
         uint8_t leftChr = *strLeft;
         uint8_t rightChr = *strRight;
         if ( leftChr < rightChr )
         {
            return 1;
         }
         else if ( leftChr > rightChr )
         {
            return 0;
         }
         else
         {
            strLeft++;
            strRight++;
            remainLeft--;
            remainRight--;
         }
      }
   }
   return 0;
}